

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

AssertionExpr *
slang::ast::UnaryAssertionExpr::fromSyntax
          (UnarySelectPropertyExprSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  AssertionExpr *this_00;
  int iVar1;
  undefined4 extraout_var;
  UnaryAssertionExpr *pUVar2;
  bitmask<slang::ast::ASTFlags> addedFlags;
  SequenceRange SVar3;
  UnaryAssertionOperator op;
  UnaryAssertionOperator local_6c;
  _Storage<slang::ast::SequenceRange,_true> local_68;
  char local_5c;
  ASTContext local_58;
  
  this = ((context->scope).ptr)->compilation;
  local_6c = getUnaryOp((syntax->op).kind);
  local_5c = '\0';
  if (syntax->selector != (SelectorSyntax *)0x0) {
    SVar3 = SequenceRange::fromSyntax
                      (syntax->selector,context,local_6c == SEventually || local_6c == Always);
    local_68._0_8_ = SVar3._0_8_;
    local_68._M_value.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_engaged =
         (bool)SVar3.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_engaged;
    if (local_5c == '\0') {
      local_5c = '\x01';
    }
  }
  if ((((Eventually < local_6c) || ((0x2aU >> (local_6c & 0x1f) & 1) == 0)) || (local_5c != '\x01'))
     || (addedFlags.m_bits = 0x400000, local_68._M_value.min == 0)) {
    addedFlags.m_bits = (ulong)((local_6c & ~SEventually) == Not) << 0x15;
  }
  this_00 = (AssertionExpr *)(syntax->expr).ptr;
  ASTContext::resetFlags(&local_58,context,addedFlags);
  iVar1 = AssertionExpr::bind(this_00,(int)&local_58,(sockaddr *)0x0,0);
  pUVar2 = BumpAllocator::
           emplace<slang::ast::UnaryAssertionExpr,slang::ast::UnaryAssertionOperator&,slang::ast::AssertionExpr_const&,std::optional<slang::ast::SequenceRange>&>
                     (&this->super_BumpAllocator,&local_6c,
                      (AssertionExpr *)CONCAT44(extraout_var,iVar1),
                      (optional<slang::ast::SequenceRange> *)&local_68._M_value);
  return &pUVar2->super_AssertionExpr;
}

Assistant:

AssertionExpr& UnaryAssertionExpr::fromSyntax(const UnarySelectPropertyExprSyntax& syntax,
                                              const ASTContext& context) {
    auto& comp = context.getCompilation();
    auto op = getUnaryOp(syntax.op.kind);

    std::optional<SequenceRange> range;
    if (syntax.selector) {
        bool allowUnbounded = op == UnaryAssertionOperator::Always ||
                              op == UnaryAssertionOperator::SEventually;
        range = SequenceRange::fromSyntax(*syntax.selector, context, allowUnbounded);
    }

    bitmask<ASTFlags> extraFlags;
    if ((op == UnaryAssertionOperator::Always || op == UnaryAssertionOperator::NextTime ||
         op == UnaryAssertionOperator::Eventually) &&
        range && range->min > 0) {
        extraFlags = ASTFlags::PropertyTimeAdvance;
    }
    else if (isNegationOp(op)) {
        extraFlags = ASTFlags::PropertyNegation;
    }

    auto& expr = bind(*syntax.expr, context.resetFlags(extraFlags));

    return *comp.emplace<UnaryAssertionExpr>(op, expr, range);
}